

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O0

void cpx_E4(void)

{
  byte bVar1;
  byte local_a;
  uint flags;
  
  except = '\0';
  bVar1 = getbyte(pc);
  temp1 = RAM[bVar1];
  asm("push ax");
  asm("CLC");
  if (carry_f == '\0') {
    asm("STC");
  }
  _AL = x_reg;
  _AH = temp1;
  asm("cmp AL,AH");
  asm("pushf");
  asm("pop flags");
  asm("pop AX");
  carry_f = local_a & 1 ^ 1;
  result_f = local_a & 0xc0 ^ 0x40;
  pc = pc + 1;
  return;
}

Assistant:

void cpx_E4(void) {
    uint flags;
    CLE;
    temp1 = RAM[getbyte(pc)];

    asm("push ax");

    asm("CLC");
    if (!carry_f) asm("STC");

    _AL = x_reg;
    _AH = temp1;

    asm("cmp AL,AH");
    asm("pushf");
    asm("pop flags");
    asm("pop AX");

    carry_f = (flags & 1) ^ 1;
    result_f = flags & 0xC0;
    result_f ^= 0x40;

    pc++;
}